

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

void Str_NtkBalanceMulti2
               (Gia_Man_t *pNew,Str_Ntk_t *p,Str_Obj_t *pObj,Vec_Int_t *vDelay,int nLutSize)

{
  int iVar1;
  int iVar2;
  int local_30;
  int k;
  int nLutSize_local;
  Vec_Int_t *vDelay_local;
  Str_Obj_t *pObj_local;
  Str_Ntk_t *p_local;
  Gia_Man_t *pNew_local;
  
  pObj->iCopy = (uint)(((undefined1  [16])*pObj & (undefined1  [16])0xf) == (undefined1  [16])0x3);
  for (local_30 = 0; local_30 < (int)(*(uint *)pObj >> 4); local_30 = local_30 + 1) {
    if (((undefined1  [16])*pObj & (undefined1  [16])0xf) == (undefined1  [16])0x3) {
      iVar2 = pObj->iCopy;
      iVar1 = Str_ObjFaninCopy(p,pObj,local_30);
      iVar2 = Gia_ManHashAnd(pNew,iVar2,iVar1);
      pObj->iCopy = iVar2;
    }
    else {
      iVar2 = pObj->iCopy;
      iVar1 = Str_ObjFaninCopy(p,pObj,local_30);
      iVar2 = Gia_ManHashXorReal(pNew,iVar2,iVar1);
      pObj->iCopy = iVar2;
    }
    iVar2 = Abc_Lit2Var(pObj->iCopy);
    Str_ObjDelay(pNew,iVar2,nLutSize,vDelay);
  }
  return;
}

Assistant:

void Str_NtkBalanceMulti2( Gia_Man_t * pNew, Str_Ntk_t * p, Str_Obj_t * pObj, Vec_Int_t * vDelay, int nLutSize )
{
    int k;
    pObj->iCopy = (pObj->Type == STR_AND);
    for ( k = 0; k < (int)pObj->nFanins; k++ )
    {
        if ( pObj->Type == STR_AND )
            pObj->iCopy = Gia_ManHashAnd( pNew, pObj->iCopy, Str_ObjFaninCopy(p, pObj, k) );
        else
            pObj->iCopy = Gia_ManHashXorReal( pNew, pObj->iCopy, Str_ObjFaninCopy(p, pObj, k) );
        Str_ObjDelay( pNew, Abc_Lit2Var(pObj->iCopy), nLutSize, vDelay );
    }
}